

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gamefield.c
# Opt level: O0

uint8_t * GetRawColor32Array(Gamefield *gamefield)

{
  uint8_t *puVar1;
  long lVar2;
  long in_RDI;
  int i;
  size_t pixelArrayIndex;
  uint8_t *pixelArray;
  int local_1c;
  long local_18;
  
  puVar1 = (uint8_t *)malloc((ulong)(uint)(*(int *)(in_RDI + 4) * *(int *)(in_RDI + 8) * 4));
  local_18 = 0;
  for (local_1c = 0; local_1c < 0x13c680; local_1c = local_1c + 1) {
    puVar1[local_18] = *(uint8_t *)(*(long *)(in_RDI + 0x10) + (long)local_1c * 0x14);
    puVar1[local_18 + 1] = *(uint8_t *)(*(long *)(in_RDI + 0x10) + (long)local_1c * 0x14 + 1);
    lVar2 = local_18 + 3;
    puVar1[local_18 + 2] = *(uint8_t *)(*(long *)(in_RDI + 0x10) + (long)local_1c * 0x14 + 2);
    local_18 = local_18 + 4;
    puVar1[lVar2] = *(uint8_t *)(*(long *)(in_RDI + 0x10) + (long)local_1c * 0x14 + 3);
  }
  return puVar1;
}

Assistant:

uint8_t* GetRawColor32Array(Gamefield* gamefield) {
    uint8_t* pixelArray = malloc(gamefield->width * gamefield->height * 4);
    size_t pixelArrayIndex = 0;
    for (int i = 0; i < GAMEFIELD_SIZE; i++) {
        pixelArray[pixelArrayIndex++] = gamefield->pixels[i].color.r;
        pixelArray[pixelArrayIndex++] = gamefield->pixels[i].color.g;
        pixelArray[pixelArrayIndex++] = gamefield->pixels[i].color.b;
        pixelArray[pixelArrayIndex++] = gamefield->pixels[i].color.a;
    }
    return pixelArray;
}